

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

KeyValue * __thiscall duckdb_parquet::KeyValue::operator=(KeyValue *this,KeyValue *other90)

{
  std::__cxx11::string::_M_assign((string *)&this->key);
  std::__cxx11::string::_M_assign((string *)&this->value);
  this->__isset = other90->__isset;
  return this;
}

Assistant:

KeyValue& KeyValue::operator=(const KeyValue& other90) {
  key = other90.key;
  value = other90.value;
  __isset = other90.__isset;
  return *this;
}